

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

OutPt * __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  EdgeSide EVar1;
  OutPt *pOVar2;
  OutPt *pOVar3;
  cInt cVar4;
  OutRec *pOVar5;
  OutPt *pOVar6;
  ClipperBase *this_00;
  
  this_00 = (ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  if ((long)e->OutIdx < 0) {
    pOVar5 = ClipperBase::CreateOutRec(this_00);
    pOVar5->IsOpen = e->WindDelta == 0;
    pOVar6 = (OutPt *)operator_new(0x28);
    (pOVar6->Pt).X = 0;
    (pOVar6->Pt).Y = 0;
    pOVar5->Pts = pOVar6;
    pOVar6->Idx = pOVar5->Idx;
    cVar4 = pt->Y;
    (pOVar6->Pt).X = pt->X;
    (pOVar6->Pt).Y = cVar4;
    pOVar6->Next = pOVar6;
    pOVar6->Prev = pOVar6;
    if (pOVar5->IsOpen == false) {
      SetHoleState(this,e,pOVar5);
    }
    e->OutIdx = pOVar5->Idx;
  }
  else {
    pOVar5 = (this_00->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_start[e->OutIdx];
    pOVar2 = pOVar5->Pts;
    EVar1 = e->Side;
    if (EVar1 == esLeft) {
      if ((pt->X == (pOVar2->Pt).X) && (pt->Y == (pOVar2->Pt).Y)) {
        return pOVar2;
      }
    }
    else {
      pOVar6 = pOVar2->Prev;
      if ((pt->X == (pOVar6->Pt).X) && (pt->Y == (pOVar6->Pt).Y)) {
        return pOVar6;
      }
    }
    pOVar6 = (OutPt *)operator_new(0x28);
    (pOVar6->Pt).X = 0;
    (pOVar6->Pt).Y = 0;
    pOVar6->Idx = pOVar5->Idx;
    cVar4 = pt->Y;
    (pOVar6->Pt).X = pt->X;
    (pOVar6->Pt).Y = cVar4;
    pOVar6->Next = pOVar2;
    pOVar3 = pOVar2->Prev;
    pOVar6->Prev = pOVar3;
    pOVar3->Next = pOVar6;
    pOVar2->Prev = pOVar6;
    if (EVar1 == esLeft) {
      pOVar5->Pts = pOVar6;
    }
  }
  return pOVar6;
}

Assistant:

OutPt* Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  if(  e->OutIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    outRec->IsOpen = (e->WindDelta == 0);
    OutPt* newOp = new OutPt;
    outRec->Pts = newOp;
    newOp->Idx = outRec->Idx;
    newOp->Pt = pt;
    newOp->Next = newOp;
    newOp->Prev = newOp;
    if (!outRec->IsOpen)
      SetHoleState(e, outRec);
    e->OutIdx = outRec->Idx;
    return newOp;
  } else
  {
    OutRec *outRec = m_PolyOuts[e->OutIdx];
    //OutRec.Pts is the 'Left-most' point & OutRec.Pts.Prev is the 'Right-most'
    OutPt* op = outRec->Pts;

	bool ToFront = (e->Side == esLeft);
	if (ToFront && (pt == op->Pt)) return op;
    else if (!ToFront && (pt == op->Prev->Pt)) return op->Prev;

    OutPt* newOp = new OutPt;
    newOp->Idx = outRec->Idx;
    newOp->Pt = pt;
    newOp->Next = op;
    newOp->Prev = op->Prev;
    newOp->Prev->Next = newOp;
    op->Prev = newOp;
    if (ToFront) outRec->Pts = newOp;
    return newOp;
  }
}